

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O2

void Controller::click::InternalClicker::clicker
               (int given_x,int given_y,bool autodiscover,Minefield *mfield,bool only_autodiscover,
               bool called_during_autodiscover)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int y;
  int iVar5;
  int local_48 [6];
  
  bVar1 = Minefield::isPosValid(mfield,given_x,given_y);
  if (((!bVar1) || (bVar1 = Minefield::isGameRunning(mfield), !bVar1)) ||
     (bVar1 = Minefield::isFlagged(mfield,given_x,given_y), bVar1)) {
    return;
  }
  if ((!autodiscover) || (bVar1 = Minefield::isOpen(mfield,given_x,given_y), !bVar1)) {
    if ((!called_during_autodiscover) &&
       (iVar5 = Minefield::getOpenCount(mfield), only_autodiscover && iVar5 != 0)) {
      return;
    }
    Minefield::open(mfield,given_x,given_y,1);
    return;
  }
  local_48[3] = -1;
  local_48[4] = 0;
  local_48[5] = 1;
  iVar5 = 0;
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    iVar4 = *(int *)((long)local_48 + lVar2 + 0xc) + given_x;
    local_48[0] = -1;
    local_48[1] = 0;
    local_48[2] = 1;
    for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
      y = *(int *)((long)local_48 + lVar3) + given_y;
      bVar1 = Minefield::isPosValid(mfield,iVar4,y);
      if (bVar1) {
        bVar1 = Minefield::isFlagged(mfield,iVar4,y);
        iVar5 = iVar5 + (uint)bVar1;
      }
    }
  }
  if (iVar5 == 0) {
    return;
  }
  iVar4 = Minefield::getSorroundingMineCount(mfield,given_x,given_y);
  if (iVar4 != iVar5) {
    return;
  }
  local_48[3] = -1;
  local_48[4] = 0;
  local_48[5] = 1;
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    iVar5 = *(int *)((long)local_48 + lVar2 + 0xc);
    local_48[0] = -1;
    local_48[1] = 0;
    local_48[2] = 1;
    for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
      clicker(iVar5 + given_x,*(int *)((long)local_48 + lVar3) + given_y,false,mfield,
              only_autodiscover,true);
    }
  }
  return;
}

Assistant:

static void clicker(int given_x, int given_y, bool autodiscover, Minefield& mfield, bool only_autodiscover, bool called_during_autodiscover = false) {
                // check pos
                if (mfield.isPosValid(given_x, given_y)) {
                    // only do stuff while game is still running
                    if (mfield.isGameRunning()) {
                        // only click on fields w/o flags
                        if(! mfield.isFlagged(given_x, given_y)) {
                            if (autodiscover && mfield.isOpen(given_x, given_y)) {
                                // already open -> autodiscover
                                // if all sorrounding mines are flagged -> open all other sorrounding fields
                                int flag_count = 0;
                                for (int dx : {-1, 0, 1}) {
                                    for (int dy: {-1, 0, 1}) {
                                        if (mfield.isPosValid(given_x + dx, given_y + dy)) {
                                            if (mfield.isFlagged(given_x + dx, given_y + dy)) {
                                                flag_count++;
                                            }
                                        }
                                    }
                                }

                                // don't treat 0 sorrounding mines, because handled by open function
                                if (0 != flag_count && mfield.getSorroundingMineCount(given_x, given_y) == flag_count) {
                                    for (int dx : {-1, 0, 1}) {
                                        for (int dy: {-1, 0, 1}) {
                                            clicker(given_x + dx, given_y + dy, false, mfield, only_autodiscover, true);
                                        }
                                    }
                                }
                            } else {
                                // no autodiscover -> open regularly
                                // unless autodiscover only enable
                                // unless called from autodiscover or no field opened yet
                                if (called_during_autodiscover || 0 == mfield.getOpenCount() || !only_autodiscover) {
                                    mfield.open(given_x, given_y);
                                }
                            }
                        }
                    }
                }
            }